

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StorageReader.cpp
# Opt level: O2

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
MILBlob::Blob::StorageReader::Impl::GetAllOffsets
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,Impl *this)

{
  storage_header *psVar1;
  int iVar2;
  ulong __n;
  blob_metadata metadata;
  value_type_conflict8 local_70;
  blob_metadata local_68;
  
  EnsureLoaded(this);
  psVar1 = MMapFileReader::ReadStruct<MILBlob::Blob::storage_header>
                     ((this->m_reader)._M_t.
                      super___uniq_ptr_impl<const_MILBlob::Blob::MMapFileReader,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_const_MILBlob::Blob::MMapFileReader_*,_std::default_delete<const_MILBlob::Blob::MMapFileReader>_>
                      .super__Head_base<0UL,_const_MILBlob::Blob::MMapFileReader_*,_false>.
                      _M_head_impl,0);
  __n = (ulong)psVar1->count;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(__return_storage_ptr__,__n);
  local_70 = 0x40;
  while (iVar2 = (int)__n, __n = (ulong)(iVar2 - 1), iVar2 != 0) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              (__return_storage_ptr__,&local_70);
    GetMetadata(&local_68,this,local_70);
    local_70 = local_68.sizeInBytes + local_68.offset + 0x3f & 0xffffffffffffffc0;
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint64_t> GetAllOffsets() const
    {
        EnsureLoaded();

        const auto& header = m_reader->ReadStruct<storage_header>(0);
        auto numBlobs = header.count;

        std::vector<uint64_t> allOffsets;
        allOffsets.reserve(numBlobs);
        // The first metadata offset lies just after the file header.
        uint64_t currMetadataOffset = sizeof(storage_header);
        for (uint32_t i = 0; i < numBlobs; ++i) {
            allOffsets.push_back(currMetadataOffset);
            auto metadata = GetMetadata(currMetadataOffset);
            // Update offset for next iteration to aligned value.
            currMetadataOffset = metadata.offset + metadata.sizeInBytes;
            if (currMetadataOffset % DefaultStorageAlignment != 0) {
                currMetadataOffset += DefaultStorageAlignment - currMetadataOffset % DefaultStorageAlignment;
            }
        }
        return allOffsets;
    }